

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O2

void testIsComplete(string *tempDir)

{
  uint __line;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  char cVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  char *__assertion;
  int x;
  long lVar12;
  int y;
  long lVar13;
  RgbaOutputFile out;
  half local_13c;
  half local_13a;
  Array2D<Imf_3_2::Rgba> pixels;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  string ict;
  string ct;
  string icsl;
  string csl;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"Testing isComplete() function");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator+(&csl,tempDir,"imf_test_complete_sl.exr");
  std::operator+(&icsl,tempDir,"imf_test_incomplete_sl.exr");
  std::operator+(&ct,tempDir,"imf_test_complete_t.exr");
  std::operator+(&ict,tempDir,"imf_test_incomplete_t.exr");
  _Var4 = csl._M_dataplus;
  _Var3 = icsl._M_dataplus;
  _Var2 = ct._M_dataplus;
  _Var1 = ict._M_dataplus;
  pixels._sizeX = 0x121;
  pixels._sizeY = 0x147;
  pixels._data = (Rgba *)operator_new__(0xb8938);
  lVar10 = 0;
  for (lVar13 = 0; lVar13 != 0x121; lVar13 = lVar13 + 1) {
    for (lVar12 = 0; lVar12 != 0x147; lVar12 = lVar12 + 1) {
      Imath_3_2::half::half(&local_13a,(float)(int)lVar12);
      Imath_3_2::half::half(&local_13c,(float)(int)lVar13);
      *(ulong *)((long)&pixels._data[lVar12].r._h + pixels._sizeY * lVar10) =
           (ulong)CONCAT22(local_13c._h,local_13a._h) | 0x3c00000000000000;
    }
    lVar10 = lVar10 + 8;
  }
  local_b8 = 0;
  uVar9 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var4._M_p,0x147,0x121,0xf,&local_b8,0,4,
             uVar9);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  iVar11 = (int)&out;
  Imf_3_2::RgbaOutputFile::writePixels(iVar11);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  local_c0 = 0;
  uVar9 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var3._M_p,0x147,0x121,0xf,&local_c0,0,4,
             uVar9);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  Imf_3_2::RgbaOutputFile::writePixels(iVar11);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  local_c8 = 0;
  uVar9 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var2._M_p,0x147,0x121,0x11,0x11,0,0,
             0xf,&local_c8,0,3,uVar9);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar11);
  iVar7 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar11);
  Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar11,0,iVar6 + -1,0,iVar7 + -1);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  local_d0 = 0;
  uVar9 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var1._M_p,0x147,0x121,0x11,0x11,0,0,
             0xf,&local_d0,0,3,uVar9);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels._data,1);
  iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar11);
  iVar7 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar11);
  Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar11,0,iVar6 + -1,0,iVar7 + -2);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels);
  _Var4 = csl._M_dataplus;
  _Var3 = icsl._M_dataplus;
  _Var2 = ct._M_dataplus;
  _Var1 = ict._M_dataplus;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var4._M_p,iVar6);
  cVar5 = Imf_3_2::RgbaInputFile::isComplete();
  if (cVar5 == '\0') {
    __assertion = "in.isComplete ()";
    __line = 0x53;
  }
  else {
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var3._M_p,iVar6);
    cVar5 = Imf_3_2::RgbaInputFile::isComplete();
    if (cVar5 == '\0') {
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var2._M_p,iVar6);
      cVar5 = Imf_3_2::RgbaInputFile::isComplete();
      if (cVar5 == '\0') {
        __assertion = "in.isComplete ()";
        __line = 0x5d;
      }
      else {
        Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
        iVar6 = Imf_3_2::globalThreadCount();
        Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&pixels,_Var1._M_p,iVar6);
        cVar5 = Imf_3_2::RgbaInputFile::isComplete();
        if (cVar5 == '\0') {
          Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&pixels);
          iVar6 = Imf_3_2::globalThreadCount();
          Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&pixels,_Var2._M_p,iVar6);
          cVar5 = Imf_3_2::TiledRgbaInputFile::isComplete();
          if (cVar5 == '\0') {
            __assertion = "in.isComplete ()";
            __line = 0x67;
          }
          else {
            Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&pixels);
            iVar6 = Imf_3_2::globalThreadCount();
            Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
                      ((TiledRgbaInputFile *)&pixels,_Var1._M_p,iVar6);
            cVar5 = Imf_3_2::TiledRgbaInputFile::isComplete();
            if (cVar5 == '\0') {
              Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&pixels);
              remove(csl._M_dataplus._M_p);
              remove(icsl._M_dataplus._M_p);
              remove(ct._M_dataplus._M_p);
              remove(ict._M_dataplus._M_p);
              poVar8 = std::operator<<((ostream *)&std::cout,"ok\n");
              std::endl<char,std::char_traits<char>>(poVar8);
              std::__cxx11::string::~string((string *)&ict);
              std::__cxx11::string::~string((string *)&ct);
              std::__cxx11::string::~string((string *)&icsl);
              std::__cxx11::string::~string((string *)&csl);
              return;
            }
            __assertion = "!in.isComplete ()";
            __line = 0x6c;
          }
        }
        else {
          __assertion = "!in.isComplete ()";
          __line = 0x62;
        }
      }
    }
    else {
      __assertion = "!in.isComplete ()";
      __line = 0x58;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                ,__line,
                "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
               );
}

Assistant:

void
testIsComplete (const std::string& tempDir)
{
    try
    {
        cout << "Testing isComplete() function" << endl;

        std::string csl  = tempDir + "imf_test_complete_sl.exr";
        std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
        std::string ct   = tempDir + "imf_test_complete_t.exr";
        std::string ict  = tempDir + "imf_test_incomplete_t.exr";

        writeFiles (
            csl.c_str (),
            icsl.c_str (),
            ct.c_str (),
            ict.c_str (),
            327,
            289,
            17,
            17);
        checkFiles (csl.c_str (), icsl.c_str (), ct.c_str (), ict.c_str ());

        remove (csl.c_str ());
        remove (icsl.c_str ());
        remove (ct.c_str ());
        remove (ict.c_str ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}